

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to8.h
# Opt level: O1

void ncnn::convolution_im2col_sgemm_transform_kernel_pack1to8_avx
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  void *pvVar7;
  long lVar8;
  uint _w;
  ulong uVar9;
  void *pvVar10;
  ulong uVar11;
  ulong uVar12;
  undefined4 *puVar13;
  Mat local_78;
  
  _w = kernel_w * kernel_h;
  Mat::reshape(&local_78,_kernel,_w,inch,outch,(Allocator *)0x0);
  iVar6 = outch + 7;
  if (-1 < outch) {
    iVar6 = outch;
  }
  Mat::create(kernel_tm,_w * 8,inch,iVar6 >> 3,4,(Allocator *)0x0);
  if (7 < outch) {
    pvVar1 = kernel_tm->data;
    sVar2 = kernel_tm->cstep;
    sVar3 = kernel_tm->elemsize;
    lVar8 = local_78.elemsize * local_78.cstep;
    pvVar7 = local_78.data;
    uVar12 = 0;
    do {
      if (0 < inch) {
        puVar13 = (undefined4 *)((uVar12 >> 3) * sVar2 * sVar3 + (long)pvVar1);
        uVar11 = 0;
        pvVar10 = pvVar7;
        do {
          if (0 < (int)_w) {
            uVar9 = 0;
            do {
              *puVar13 = *(undefined4 *)((long)pvVar10 + uVar9 * 4);
              lVar4 = lVar8 + uVar9 * 4;
              puVar13[1] = *(undefined4 *)((long)pvVar10 + lVar8 + uVar9 * 4);
              lVar5 = lVar8 + lVar4;
              puVar13[2] = *(undefined4 *)((long)pvVar10 + lVar8 + lVar4);
              lVar4 = lVar8 + lVar5;
              puVar13[3] = *(undefined4 *)((long)pvVar10 + lVar8 + lVar5);
              lVar5 = lVar8 + lVar4;
              puVar13[4] = *(undefined4 *)((long)pvVar10 + lVar8 + lVar4);
              lVar4 = lVar8 + lVar5;
              puVar13[5] = *(undefined4 *)((long)pvVar10 + lVar8 + lVar5);
              puVar13[6] = *(undefined4 *)((long)pvVar10 + lVar8 + lVar4);
              puVar13[7] = *(undefined4 *)((long)pvVar10 + lVar8 * 2 + lVar4);
              puVar13 = puVar13 + 8;
              uVar9 = uVar9 + 1;
            } while (_w != uVar9);
          }
          uVar11 = uVar11 + 1;
          pvVar10 = (void *)((long)pvVar10 + (long)local_78.w * local_78.elemsize);
        } while (uVar11 != (uint)inch);
      }
      uVar11 = uVar12 + 0xf;
      pvVar7 = (void *)((long)pvVar7 + lVar8 * 8);
      uVar12 = uVar12 + 8;
    } while (uVar11 < (uint)outch);
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack1to8_avx(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 8b-4a-maxk-inch/4a-outch/8b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    kernel_tm.create(8 * maxk, inch, outch / 8);

    int q = 0;
    for (; q + 7 < outch; q += 8)
    {
        const Mat k0 = kernel.channel(q);
        const Mat k1 = kernel.channel(q + 1);
        const Mat k2 = kernel.channel(q + 2);
        const Mat k3 = kernel.channel(q + 3);
        const Mat k4 = kernel.channel(q + 4);
        const Mat k5 = kernel.channel(q + 5);
        const Mat k6 = kernel.channel(q + 6);
        const Mat k7 = kernel.channel(q + 7);

        float* g00 = kernel_tm.channel(q / 8);

        for (int p = 0; p < inch; p++)
        {
            const float* k00 = k0.row(p);
            const float* k10 = k1.row(p);
            const float* k20 = k2.row(p);
            const float* k30 = k3.row(p);
            const float* k40 = k4.row(p);
            const float* k50 = k5.row(p);
            const float* k60 = k6.row(p);
            const float* k70 = k7.row(p);

            for (int k = 0; k < maxk; k++)
            {
                g00[0] = k00[k];
                g00[1] = k10[k];
                g00[2] = k20[k];
                g00[3] = k30[k];
                g00[4] = k40[k];
                g00[5] = k50[k];
                g00[6] = k60[k];
                g00[7] = k70[k];

                g00 += 8;
            }
        }
    }
}